

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPlatform.cpp
# Opt level: O1

void __thiscall
vk::DeviceDriver::DeviceDriver
          (DeviceDriver *this,InstanceInterface *instanceInterface,VkDevice device)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  undefined4 extraout_var_61;
  undefined4 extraout_var_62;
  undefined4 extraout_var_63;
  undefined4 extraout_var_64;
  undefined4 extraout_var_65;
  undefined4 extraout_var_66;
  undefined4 extraout_var_67;
  undefined4 extraout_var_68;
  undefined4 extraout_var_69;
  undefined4 extraout_var_70;
  undefined4 extraout_var_71;
  undefined4 extraout_var_72;
  undefined4 extraout_var_73;
  undefined4 extraout_var_74;
  undefined4 extraout_var_75;
  undefined4 extraout_var_76;
  undefined4 extraout_var_77;
  undefined4 extraout_var_78;
  undefined4 extraout_var_79;
  undefined4 extraout_var_80;
  undefined4 extraout_var_81;
  undefined4 extraout_var_82;
  undefined4 extraout_var_83;
  undefined4 extraout_var_84;
  undefined4 extraout_var_85;
  undefined4 extraout_var_86;
  undefined4 extraout_var_87;
  undefined4 extraout_var_88;
  undefined4 extraout_var_89;
  undefined4 extraout_var_90;
  undefined4 extraout_var_91;
  undefined4 extraout_var_92;
  undefined4 extraout_var_93;
  undefined4 extraout_var_94;
  undefined4 extraout_var_95;
  undefined4 extraout_var_96;
  undefined4 extraout_var_97;
  undefined4 extraout_var_98;
  undefined4 extraout_var_99;
  undefined4 extraout_var_x00100;
  undefined4 extraout_var_x00101;
  undefined4 extraout_var_x00102;
  undefined4 extraout_var_x00103;
  undefined4 extraout_var_x00104;
  undefined4 extraout_var_x00105;
  undefined4 extraout_var_x00106;
  undefined4 extraout_var_x00107;
  undefined4 extraout_var_x00108;
  undefined4 extraout_var_x00109;
  undefined4 extraout_var_x00110;
  undefined4 extraout_var_x00111;
  undefined4 extraout_var_x00112;
  undefined4 extraout_var_x00113;
  undefined4 extraout_var_x00114;
  undefined4 extraout_var_x00115;
  undefined4 extraout_var_x00116;
  undefined4 extraout_var_x00117;
  undefined4 extraout_var_x00118;
  undefined4 extraout_var_x00119;
  undefined4 extraout_var_x00120;
  undefined4 extraout_var_x00121;
  undefined4 extraout_var_x00122;
  undefined4 extraout_var_x00123;
  undefined4 extraout_var_x00124;
  undefined4 extraout_var_x00125;
  undefined4 extraout_var_x00126;
  undefined4 extraout_var_x00127;
  undefined4 extraout_var_x00128;
  undefined4 extraout_var_x00129;
  undefined4 extraout_var_x00130;
  undefined4 extraout_var_x00131;
  undefined4 extraout_var_x00132;
  undefined4 extraout_var_x00133;
  undefined4 extraout_var_x00134;
  undefined4 extraout_var_x00135;
  undefined4 extraout_var_x00136;
  undefined4 extraout_var_x00137;
  undefined4 extraout_var_x00138;
  undefined4 extraout_var_x00139;
  undefined4 extraout_var_x00140;
  undefined4 extraout_var_x00141;
  undefined4 extraout_var_x00142;
  undefined4 extraout_var_x00143;
  undefined4 extraout_var_x00144;
  undefined4 extraout_var_x00145;
  undefined4 extraout_var_x00146;
  undefined4 extraout_var_x00147;
  undefined4 extraout_var_x00148;
  
  (this->super_DeviceInterface)._vptr_DeviceInterface = (_func_int **)&PTR_destroyDevice_00d7ed00;
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyDevice");
  (this->m_vk).destroyDevice = (DestroyDeviceFunc)CONCAT44(extraout_var,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetDeviceQueue");
  (this->m_vk).getDeviceQueue = (GetDeviceQueueFunc)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkQueueSubmit")
  ;
  (this->m_vk).queueSubmit = (QueueSubmitFunc)CONCAT44(extraout_var_01,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkQueueWaitIdle");
  (this->m_vk).queueWaitIdle = (QueueWaitIdleFunc)CONCAT44(extraout_var_02,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDeviceWaitIdle");
  (this->m_vk).deviceWaitIdle = (DeviceWaitIdleFunc)CONCAT44(extraout_var_03,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkAllocateMemory");
  (this->m_vk).allocateMemory = (AllocateMemoryFunc)CONCAT44(extraout_var_04,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkFreeMemory");
  (this->m_vk).freeMemory = (FreeMemoryFunc)CONCAT44(extraout_var_05,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkMapMemory");
  (this->m_vk).mapMemory = (MapMemoryFunc)CONCAT44(extraout_var_06,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkUnmapMemory")
  ;
  (this->m_vk).unmapMemory = (UnmapMemoryFunc)CONCAT44(extraout_var_07,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkFlushMappedMemoryRanges");
  (this->m_vk).flushMappedMemoryRanges =
       (FlushMappedMemoryRangesFunc)CONCAT44(extraout_var_08,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkInvalidateMappedMemoryRanges");
  (this->m_vk).invalidateMappedMemoryRanges =
       (InvalidateMappedMemoryRangesFunc)CONCAT44(extraout_var_09,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetDeviceMemoryCommitment");
  (this->m_vk).getDeviceMemoryCommitment =
       (GetDeviceMemoryCommitmentFunc)CONCAT44(extraout_var_10,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkBindBufferMemory");
  (this->m_vk).bindBufferMemory = (BindBufferMemoryFunc)CONCAT44(extraout_var_11,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkBindImageMemory");
  (this->m_vk).bindImageMemory = (BindImageMemoryFunc)CONCAT44(extraout_var_12,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetBufferMemoryRequirements");
  (this->m_vk).getBufferMemoryRequirements =
       (GetBufferMemoryRequirementsFunc)CONCAT44(extraout_var_13,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetImageMemoryRequirements");
  (this->m_vk).getImageMemoryRequirements =
       (GetImageMemoryRequirementsFunc)CONCAT44(extraout_var_14,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetImageSparseMemoryRequirements");
  (this->m_vk).getImageSparseMemoryRequirements =
       (GetImageSparseMemoryRequirementsFunc)CONCAT44(extraout_var_15,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkQueueBindSparse");
  (this->m_vk).queueBindSparse = (QueueBindSparseFunc)CONCAT44(extraout_var_16,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkCreateFence")
  ;
  (this->m_vk).createFence = (CreateFenceFunc)CONCAT44(extraout_var_17,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyFence");
  (this->m_vk).destroyFence = (DestroyFenceFunc)CONCAT44(extraout_var_18,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkResetFences")
  ;
  (this->m_vk).resetFences = (ResetFencesFunc)CONCAT44(extraout_var_19,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetFenceStatus");
  (this->m_vk).getFenceStatus = (GetFenceStatusFunc)CONCAT44(extraout_var_20,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkWaitForFences");
  (this->m_vk).waitForFences = (WaitForFencesFunc)CONCAT44(extraout_var_21,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateSemaphore");
  (this->m_vk).createSemaphore = (CreateSemaphoreFunc)CONCAT44(extraout_var_22,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroySemaphore");
  (this->m_vk).destroySemaphore = (DestroySemaphoreFunc)CONCAT44(extraout_var_23,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkCreateEvent")
  ;
  (this->m_vk).createEvent = (CreateEventFunc)CONCAT44(extraout_var_24,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyEvent");
  (this->m_vk).destroyEvent = (DestroyEventFunc)CONCAT44(extraout_var_25,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetEventStatus");
  (this->m_vk).getEventStatus = (GetEventStatusFunc)CONCAT44(extraout_var_26,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkSetEvent");
  (this->m_vk).setEvent = (SetEventFunc)CONCAT44(extraout_var_27,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkResetEvent");
  (this->m_vk).resetEvent = (ResetEventFunc)CONCAT44(extraout_var_28,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateQueryPool");
  (this->m_vk).createQueryPool = (CreateQueryPoolFunc)CONCAT44(extraout_var_29,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyQueryPool");
  (this->m_vk).destroyQueryPool = (DestroyQueryPoolFunc)CONCAT44(extraout_var_30,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetQueryPoolResults");
  (this->m_vk).getQueryPoolResults = (GetQueryPoolResultsFunc)CONCAT44(extraout_var_31,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateBuffer");
  (this->m_vk).createBuffer = (CreateBufferFunc)CONCAT44(extraout_var_32,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyBuffer");
  (this->m_vk).destroyBuffer = (DestroyBufferFunc)CONCAT44(extraout_var_33,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateBufferView");
  (this->m_vk).createBufferView = (CreateBufferViewFunc)CONCAT44(extraout_var_34,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyBufferView");
  (this->m_vk).destroyBufferView = (DestroyBufferViewFunc)CONCAT44(extraout_var_35,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkCreateImage")
  ;
  (this->m_vk).createImage = (CreateImageFunc)CONCAT44(extraout_var_36,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyImage");
  (this->m_vk).destroyImage = (DestroyImageFunc)CONCAT44(extraout_var_37,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetImageSubresourceLayout");
  (this->m_vk).getImageSubresourceLayout =
       (GetImageSubresourceLayoutFunc)CONCAT44(extraout_var_38,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateImageView");
  (this->m_vk).createImageView = (CreateImageViewFunc)CONCAT44(extraout_var_39,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyImageView");
  (this->m_vk).destroyImageView = (DestroyImageViewFunc)CONCAT44(extraout_var_40,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateShaderModule");
  (this->m_vk).createShaderModule = (CreateShaderModuleFunc)CONCAT44(extraout_var_41,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyShaderModule");
  (this->m_vk).destroyShaderModule = (DestroyShaderModuleFunc)CONCAT44(extraout_var_42,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreatePipelineCache");
  (this->m_vk).createPipelineCache = (CreatePipelineCacheFunc)CONCAT44(extraout_var_43,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyPipelineCache");
  (this->m_vk).destroyPipelineCache = (DestroyPipelineCacheFunc)CONCAT44(extraout_var_44,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetPipelineCacheData");
  (this->m_vk).getPipelineCacheData = (GetPipelineCacheDataFunc)CONCAT44(extraout_var_45,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkMergePipelineCaches");
  (this->m_vk).mergePipelineCaches = (MergePipelineCachesFunc)CONCAT44(extraout_var_46,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateGraphicsPipelines");
  (this->m_vk).createGraphicsPipelines =
       (CreateGraphicsPipelinesFunc)CONCAT44(extraout_var_47,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateComputePipelines");
  (this->m_vk).createComputePipelines = (CreateComputePipelinesFunc)CONCAT44(extraout_var_48,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyPipeline");
  (this->m_vk).destroyPipeline = (DestroyPipelineFunc)CONCAT44(extraout_var_49,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreatePipelineLayout");
  (this->m_vk).createPipelineLayout = (CreatePipelineLayoutFunc)CONCAT44(extraout_var_50,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyPipelineLayout");
  (this->m_vk).destroyPipelineLayout = (DestroyPipelineLayoutFunc)CONCAT44(extraout_var_51,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateSampler");
  (this->m_vk).createSampler = (CreateSamplerFunc)CONCAT44(extraout_var_52,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroySampler");
  (this->m_vk).destroySampler = (DestroySamplerFunc)CONCAT44(extraout_var_53,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateDescriptorSetLayout");
  (this->m_vk).createDescriptorSetLayout =
       (CreateDescriptorSetLayoutFunc)CONCAT44(extraout_var_54,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyDescriptorSetLayout");
  (this->m_vk).destroyDescriptorSetLayout =
       (DestroyDescriptorSetLayoutFunc)CONCAT44(extraout_var_55,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateDescriptorPool");
  (this->m_vk).createDescriptorPool = (CreateDescriptorPoolFunc)CONCAT44(extraout_var_56,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyDescriptorPool");
  (this->m_vk).destroyDescriptorPool = (DestroyDescriptorPoolFunc)CONCAT44(extraout_var_57,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkResetDescriptorPool");
  (this->m_vk).resetDescriptorPool = (ResetDescriptorPoolFunc)CONCAT44(extraout_var_58,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkAllocateDescriptorSets");
  (this->m_vk).allocateDescriptorSets = (AllocateDescriptorSetsFunc)CONCAT44(extraout_var_59,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkFreeDescriptorSets");
  (this->m_vk).freeDescriptorSets = (FreeDescriptorSetsFunc)CONCAT44(extraout_var_60,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkUpdateDescriptorSets");
  (this->m_vk).updateDescriptorSets = (UpdateDescriptorSetsFunc)CONCAT44(extraout_var_61,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateFramebuffer");
  (this->m_vk).createFramebuffer = (CreateFramebufferFunc)CONCAT44(extraout_var_62,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyFramebuffer");
  (this->m_vk).destroyFramebuffer = (DestroyFramebufferFunc)CONCAT44(extraout_var_63,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateRenderPass");
  (this->m_vk).createRenderPass = (CreateRenderPassFunc)CONCAT44(extraout_var_64,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyRenderPass");
  (this->m_vk).destroyRenderPass = (DestroyRenderPassFunc)CONCAT44(extraout_var_65,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetRenderAreaGranularity");
  (this->m_vk).getRenderAreaGranularity =
       (GetRenderAreaGranularityFunc)CONCAT44(extraout_var_66,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateCommandPool");
  (this->m_vk).createCommandPool = (CreateCommandPoolFunc)CONCAT44(extraout_var_67,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyCommandPool");
  (this->m_vk).destroyCommandPool = (DestroyCommandPoolFunc)CONCAT44(extraout_var_68,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkResetCommandPool");
  (this->m_vk).resetCommandPool = (ResetCommandPoolFunc)CONCAT44(extraout_var_69,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkAllocateCommandBuffers");
  (this->m_vk).allocateCommandBuffers = (AllocateCommandBuffersFunc)CONCAT44(extraout_var_70,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkFreeCommandBuffers");
  (this->m_vk).freeCommandBuffers = (FreeCommandBuffersFunc)CONCAT44(extraout_var_71,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkBeginCommandBuffer");
  (this->m_vk).beginCommandBuffer = (BeginCommandBufferFunc)CONCAT44(extraout_var_72,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkEndCommandBuffer");
  (this->m_vk).endCommandBuffer = (EndCommandBufferFunc)CONCAT44(extraout_var_73,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkResetCommandBuffer");
  (this->m_vk).resetCommandBuffer = (ResetCommandBufferFunc)CONCAT44(extraout_var_74,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdBindPipeline");
  (this->m_vk).cmdBindPipeline = (CmdBindPipelineFunc)CONCAT44(extraout_var_75,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdSetViewport");
  (this->m_vk).cmdSetViewport = (CmdSetViewportFunc)CONCAT44(extraout_var_76,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdSetScissor");
  (this->m_vk).cmdSetScissor = (CmdSetScissorFunc)CONCAT44(extraout_var_77,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdSetLineWidth");
  (this->m_vk).cmdSetLineWidth = (CmdSetLineWidthFunc)CONCAT44(extraout_var_78,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdSetDepthBias");
  (this->m_vk).cmdSetDepthBias = (CmdSetDepthBiasFunc)CONCAT44(extraout_var_79,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdSetBlendConstants");
  (this->m_vk).cmdSetBlendConstants = (CmdSetBlendConstantsFunc)CONCAT44(extraout_var_80,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdSetDepthBounds");
  (this->m_vk).cmdSetDepthBounds = (CmdSetDepthBoundsFunc)CONCAT44(extraout_var_81,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdSetStencilCompareMask");
  (this->m_vk).cmdSetStencilCompareMask =
       (CmdSetStencilCompareMaskFunc)CONCAT44(extraout_var_82,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdSetStencilWriteMask");
  (this->m_vk).cmdSetStencilWriteMask = (CmdSetStencilWriteMaskFunc)CONCAT44(extraout_var_83,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdSetStencilReference");
  (this->m_vk).cmdSetStencilReference = (CmdSetStencilReferenceFunc)CONCAT44(extraout_var_84,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdBindDescriptorSets");
  (this->m_vk).cmdBindDescriptorSets = (CmdBindDescriptorSetsFunc)CONCAT44(extraout_var_85,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdBindIndexBuffer");
  (this->m_vk).cmdBindIndexBuffer = (CmdBindIndexBufferFunc)CONCAT44(extraout_var_86,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdBindVertexBuffers");
  (this->m_vk).cmdBindVertexBuffers = (CmdBindVertexBuffersFunc)CONCAT44(extraout_var_87,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkCmdDraw");
  (this->m_vk).cmdDraw = (CmdDrawFunc)CONCAT44(extraout_var_88,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdDrawIndexed");
  (this->m_vk).cmdDrawIndexed = (CmdDrawIndexedFunc)CONCAT44(extraout_var_89,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdDrawIndirect");
  (this->m_vk).cmdDrawIndirect = (CmdDrawIndirectFunc)CONCAT44(extraout_var_90,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdDrawIndexedIndirect");
  (this->m_vk).cmdDrawIndexedIndirect = (CmdDrawIndexedIndirectFunc)CONCAT44(extraout_var_91,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkCmdDispatch")
  ;
  (this->m_vk).cmdDispatch = (CmdDispatchFunc)CONCAT44(extraout_var_92,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdDispatchIndirect");
  (this->m_vk).cmdDispatchIndirect = (CmdDispatchIndirectFunc)CONCAT44(extraout_var_93,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdCopyBuffer");
  (this->m_vk).cmdCopyBuffer = (CmdCopyBufferFunc)CONCAT44(extraout_var_94,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdCopyImage");
  (this->m_vk).cmdCopyImage = (CmdCopyImageFunc)CONCAT44(extraout_var_95,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdBlitImage");
  (this->m_vk).cmdBlitImage = (CmdBlitImageFunc)CONCAT44(extraout_var_96,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdCopyBufferToImage");
  (this->m_vk).cmdCopyBufferToImage = (CmdCopyBufferToImageFunc)CONCAT44(extraout_var_97,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdCopyImageToBuffer");
  (this->m_vk).cmdCopyImageToBuffer = (CmdCopyImageToBufferFunc)CONCAT44(extraout_var_98,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdUpdateBuffer");
  (this->m_vk).cmdUpdateBuffer = (CmdUpdateBufferFunc)CONCAT44(extraout_var_99,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdFillBuffer");
  (this->m_vk).cmdFillBuffer = (CmdFillBufferFunc)CONCAT44(extraout_var_x00100,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdClearColorImage");
  (this->m_vk).cmdClearColorImage = (CmdClearColorImageFunc)CONCAT44(extraout_var_x00101,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdClearDepthStencilImage");
  (this->m_vk).cmdClearDepthStencilImage =
       (CmdClearDepthStencilImageFunc)CONCAT44(extraout_var_x00102,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdClearAttachments");
  (this->m_vk).cmdClearAttachments = (CmdClearAttachmentsFunc)CONCAT44(extraout_var_x00103,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdResolveImage");
  (this->m_vk).cmdResolveImage = (CmdResolveImageFunc)CONCAT44(extraout_var_x00104,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkCmdSetEvent")
  ;
  (this->m_vk).cmdSetEvent = (CmdSetEventFunc)CONCAT44(extraout_var_x00105,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdResetEvent");
  (this->m_vk).cmdResetEvent = (CmdResetEventFunc)CONCAT44(extraout_var_x00106,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdWaitEvents");
  (this->m_vk).cmdWaitEvents = (CmdWaitEventsFunc)CONCAT44(extraout_var_x00107,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdPipelineBarrier");
  (this->m_vk).cmdPipelineBarrier = (CmdPipelineBarrierFunc)CONCAT44(extraout_var_x00108,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdBeginQuery");
  (this->m_vk).cmdBeginQuery = (CmdBeginQueryFunc)CONCAT44(extraout_var_x00109,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])(instanceInterface,device,"vkCmdEndQuery")
  ;
  (this->m_vk).cmdEndQuery = (CmdEndQueryFunc)CONCAT44(extraout_var_x00110,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdResetQueryPool");
  (this->m_vk).cmdResetQueryPool = (CmdResetQueryPoolFunc)CONCAT44(extraout_var_x00111,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdWriteTimestamp");
  (this->m_vk).cmdWriteTimestamp = (CmdWriteTimestampFunc)CONCAT44(extraout_var_x00112,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdCopyQueryPoolResults");
  (this->m_vk).cmdCopyQueryPoolResults =
       (CmdCopyQueryPoolResultsFunc)CONCAT44(extraout_var_x00113,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdPushConstants");
  (this->m_vk).cmdPushConstants = (CmdPushConstantsFunc)CONCAT44(extraout_var_x00114,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdBeginRenderPass");
  (this->m_vk).cmdBeginRenderPass = (CmdBeginRenderPassFunc)CONCAT44(extraout_var_x00115,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdNextSubpass");
  (this->m_vk).cmdNextSubpass = (CmdNextSubpassFunc)CONCAT44(extraout_var_x00116,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdEndRenderPass");
  (this->m_vk).cmdEndRenderPass = (CmdEndRenderPassFunc)CONCAT44(extraout_var_x00117,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdExecuteCommands");
  (this->m_vk).cmdExecuteCommands = (CmdExecuteCommandsFunc)CONCAT44(extraout_var_x00118,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateSwapchainKHR");
  (this->m_vk).createSwapchainKHR = (CreateSwapchainKHRFunc)CONCAT44(extraout_var_x00119,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroySwapchainKHR");
  (this->m_vk).destroySwapchainKHR = (DestroySwapchainKHRFunc)CONCAT44(extraout_var_x00120,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetSwapchainImagesKHR");
  (this->m_vk).getSwapchainImagesKHR =
       (GetSwapchainImagesKHRFunc)CONCAT44(extraout_var_x00121,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkAcquireNextImageKHR");
  (this->m_vk).acquireNextImageKHR = (AcquireNextImageKHRFunc)CONCAT44(extraout_var_x00122,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkQueuePresentKHR");
  (this->m_vk).queuePresentKHR = (QueuePresentKHRFunc)CONCAT44(extraout_var_x00123,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateSharedSwapchainsKHR");
  (this->m_vk).createSharedSwapchainsKHR =
       (CreateSharedSwapchainsKHRFunc)CONCAT44(extraout_var_x00124,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkTrimCommandPoolKHR");
  (this->m_vk).trimCommandPoolKHR = (TrimCommandPoolKHRFunc)CONCAT44(extraout_var_x00125,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDebugMarkerSetObjectTagEXT");
  (this->m_vk).debugMarkerSetObjectTagEXT =
       (DebugMarkerSetObjectTagEXTFunc)CONCAT44(extraout_var_x00126,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDebugMarkerSetObjectNameEXT");
  (this->m_vk).debugMarkerSetObjectNameEXT =
       (DebugMarkerSetObjectNameEXTFunc)CONCAT44(extraout_var_x00127,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdDebugMarkerBeginEXT");
  (this->m_vk).cmdDebugMarkerBeginEXT =
       (CmdDebugMarkerBeginEXTFunc)CONCAT44(extraout_var_x00128,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdDebugMarkerEndEXT");
  (this->m_vk).cmdDebugMarkerEndEXT = (CmdDebugMarkerEndEXTFunc)CONCAT44(extraout_var_x00129,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdDebugMarkerInsertEXT");
  (this->m_vk).cmdDebugMarkerInsertEXT =
       (CmdDebugMarkerInsertEXTFunc)CONCAT44(extraout_var_x00130,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdDrawIndirectCountAMD");
  (this->m_vk).cmdDrawIndirectCountAMD =
       (CmdDrawIndirectCountAMDFunc)CONCAT44(extraout_var_x00131,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdDrawIndexedIndirectCountAMD");
  (this->m_vk).cmdDrawIndexedIndirectCountAMD =
       (CmdDrawIndexedIndirectCountAMDFunc)CONCAT44(extraout_var_x00132,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetMemoryWin32HandleNV");
  (this->m_vk).getMemoryWin32HandleNV =
       (GetMemoryWin32HandleNVFunc)CONCAT44(extraout_var_x00133,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdProcessCommandsNVX");
  (this->m_vk).cmdProcessCommandsNVX =
       (CmdProcessCommandsNVXFunc)CONCAT44(extraout_var_x00134,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdReserveSpaceForCommandsNVX");
  (this->m_vk).cmdReserveSpaceForCommandsNVX =
       (CmdReserveSpaceForCommandsNVXFunc)CONCAT44(extraout_var_x00135,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateIndirectCommandsLayoutNVX");
  (this->m_vk).createIndirectCommandsLayoutNVX =
       (CreateIndirectCommandsLayoutNVXFunc)CONCAT44(extraout_var_x00136,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyIndirectCommandsLayoutNVX");
  (this->m_vk).destroyIndirectCommandsLayoutNVX =
       (DestroyIndirectCommandsLayoutNVXFunc)CONCAT44(extraout_var_x00137,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateObjectTableNVX");
  (this->m_vk).createObjectTableNVX = (CreateObjectTableNVXFunc)CONCAT44(extraout_var_x00138,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyObjectTableNVX");
  (this->m_vk).destroyObjectTableNVX =
       (DestroyObjectTableNVXFunc)CONCAT44(extraout_var_x00139,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkRegisterObjectsNVX");
  (this->m_vk).registerObjectsNVX = (RegisterObjectsNVXFunc)CONCAT44(extraout_var_x00140,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkUnregisterObjectsNVX");
  (this->m_vk).unregisterObjectsNVX = (UnregisterObjectsNVXFunc)CONCAT44(extraout_var_x00141,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdPushDescriptorSetKHR");
  (this->m_vk).cmdPushDescriptorSetKHR =
       (CmdPushDescriptorSetKHRFunc)CONCAT44(extraout_var_x00142,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCreateDescriptorUpdateTemplateKHR");
  (this->m_vk).createDescriptorUpdateTemplateKHR =
       (CreateDescriptorUpdateTemplateKHRFunc)CONCAT44(extraout_var_x00143,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkDestroyDescriptorUpdateTemplateKHR");
  (this->m_vk).destroyDescriptorUpdateTemplateKHR =
       (DestroyDescriptorUpdateTemplateKHRFunc)CONCAT44(extraout_var_x00144,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkUpdateDescriptorSetWithTemplateKHR");
  (this->m_vk).updateDescriptorSetWithTemplateKHR =
       (UpdateDescriptorSetWithTemplateKHRFunc)CONCAT44(extraout_var_x00145,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkCmdPushDescriptorSetWithTemplateKHR");
  (this->m_vk).cmdPushDescriptorSetWithTemplateKHR =
       (CmdPushDescriptorSetWithTemplateKHRFunc)CONCAT44(extraout_var_x00146,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetRefreshCycleDurationGOOGLE");
  (this->m_vk).getRefreshCycleDurationGOOGLE =
       (GetRefreshCycleDurationGOOGLEFunc)CONCAT44(extraout_var_x00147,iVar1);
  iVar1 = (*instanceInterface->_vptr_InstanceInterface[8])
                    (instanceInterface,device,"vkGetPastPresentationTimingGOOGLE");
  (this->m_vk).getPastPresentationTimingGOOGLE =
       (GetPastPresentationTimingGOOGLEFunc)CONCAT44(extraout_var_x00148,iVar1);
  return;
}

Assistant:

DeviceDriver::DeviceDriver (const InstanceInterface& instanceInterface, VkDevice device)
{
#define GET_PROC_ADDR(NAME) instanceInterface.getDeviceProcAddr(device, NAME)
#include "vkInitDeviceFunctionPointers.inl"
#undef GET_PROC_ADDR
}